

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this,Numeral *numeral,PolyNf *term
          )

{
  Monom *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RSI;
  RealConstantType *in_RDI;
  RealConstantType *in_stack_ffffffffffffff28;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_stack_ffffffffffffff40;
  Numeral *in_stack_ffffffffffffff48;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff50;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff68;
  PolyNf *in_stack_ffffffffffffff98;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffffa0;
  
  RealConstantType::RealConstantType(in_RDI,in_stack_ffffffffffffff28);
  PolyNf::PolyNf((PolyNf *)in_RDI,(PolyNf *)in_stack_ffffffffffffff28);
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            (in_stack_ffffffffffffff68);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Polynom(in_RSI,in_RDX);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
            ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x45a078);
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::~MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x45a082);
  RealConstantType::~RealConstantType((RealConstantType *)0x45a08c);
  return;
}

Assistant:

Polynom<Number>::Polynom(Numeral numeral, PolyNf term) 
  : Polynom(Monom(numeral, perfect(MonomFactors(term))))
{  }